

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O3

optional<double> __thiscall wasm::WATParser::anon_unknown_11::ParseInput::takeF64(ParseInput *this)

{
  undefined4 uVar1;
  optional<double> oVar2;
  Token local_78;
  char local_38;
  _Storage<double,_true> local_28;
  
  if (((this->lexer).curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
       super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
       super__Optional_payload_base<wasm::WATParser::Token>._M_engaged == true) &&
     ((this->lexer).index != 0)) {
    local_78.span._M_len =
         (this->lexer).curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
         super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
         super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.span._M_len;
    local_78.span._M_str =
         *(char **)((long)&(this->lexer).curr.
                           super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                           super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                           super__Optional_payload_base<wasm::WATParser::Token>._M_payload + 8);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       *)&local_78.data,
                      (_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       *)((long)&(this->lexer).curr.
                                 super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                 _M_payload.
                                 super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                 .super__Optional_payload_base<wasm::WATParser::Token>._M_payload +
                         0x10));
    local_38 = '\x01';
    oVar2 = Token::getF64(&local_78);
    local_28 = oVar2.super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_payload;
    uVar1 = oVar2.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._8_4_;
    if (((undefined1  [16])
         oVar2.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar1 = 0;
    }
    else {
      Lexer::skipSpace(&this->lexer);
      Lexer::lexToken(&this->lexer);
    }
  }
  else {
    local_38 = '\0';
    uVar1 = 0;
  }
  if (local_38 == '\x01') {
    local_38 = 0;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         *)&local_78.data);
  }
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _8_4_ = uVar1;
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = local_28;
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _12_4_ = 0;
  return (optional<double>)
         oVar2.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

std::optional<double> takeF64() {
    if (auto t = peek()) {
      if (auto d = t->getF64()) {
        ++lexer;
        return d;
      }
    }
    return std::nullopt;
  }